

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svc_layercontext.c
# Opt level: O1

void av1_free_svc_cyclic_refresh(AV1_COMP *cpi)

{
  LAYER_CONTEXT *pLVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  long lVar5;
  
  if (0 < (cpi->svc).number_spatial_layers) {
    iVar4 = 0;
    do {
      iVar2 = (cpi->svc).number_temporal_layers;
      if (0 < iVar2) {
        lVar5 = 0;
        do {
          pLVar1 = (cpi->svc).layer_context;
          lVar3 = iVar2 * iVar4 + lVar5;
          aom_free(pLVar1[lVar3].map);
          pLVar1[lVar3].map = (int8_t *)0x0;
          iVar2 = (cpi->svc).number_temporal_layers;
          lVar5 = lVar5 + 1;
        } while ((int)lVar5 < iVar2);
      }
      iVar4 = iVar4 + 1;
    } while (iVar4 < (cpi->svc).number_spatial_layers);
  }
  return;
}

Assistant:

void av1_free_svc_cyclic_refresh(AV1_COMP *const cpi) {
  SVC *const svc = &cpi->svc;
  for (int sl = 0; sl < svc->number_spatial_layers; ++sl) {
    for (int tl = 0; tl < svc->number_temporal_layers; ++tl) {
      int layer = LAYER_IDS_TO_IDX(sl, tl, svc->number_temporal_layers);
      LAYER_CONTEXT *const lc = &svc->layer_context[layer];
      aom_free(lc->map);
      lc->map = NULL;
    }
  }
}